

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::BeginDragDropSource(ImGuiDragDropFlags flags)

{
  bool bVar1;
  ImGuiID id;
  uint *puVar2;
  char *pcVar3;
  uint in_EDI;
  ImGuiWindow *unaff_retaddr;
  bool ret;
  ImGuiPayload *payload;
  bool is_hovered;
  ImGuiID source_parent_id;
  ImGuiID source_id;
  bool source_drag_active;
  ImGuiMouseButton mouse_button;
  ImGuiWindow *window;
  ImGuiContext *g;
  float in_stack_ffffffffffffffbc;
  ImGuiMouseButton in_stack_ffffffffffffffc0;
  ImGuiID in_stack_ffffffffffffffc4;
  ImRect *in_stack_ffffffffffffffc8;
  ImGuiID IVar4;
  uint3 in_stack_ffffffffffffffe0;
  uint uVar5;
  int iVar6;
  ImGuiWindow *pIVar7;
  ImGuiContext *pIVar8;
  ImGuiFocusRequestFlags in_stack_fffffffffffffffc;
  
  pIVar8 = GImGui;
  pIVar7 = GImGui->CurrentWindow;
  iVar6 = 0;
  IVar4 = 0;
  if ((in_EDI & 0x10) == 0) {
    id = (GImGui->LastItemData).ID;
    if (id == 0) {
      if ((((GImGui->IO).MouseDown[0] & 1U) == 0) || ((pIVar7->SkipItems & 1U) != 0)) {
        return false;
      }
      if ((((GImGui->LastItemData).StatusFlags & 1U) == 0) &&
         ((GImGui->ActiveId == 0 || (GImGui->ActiveIdWindow != pIVar7)))) {
        return false;
      }
      if ((in_EDI & 8) == 0) {
        return false;
      }
      id = ImGuiWindow::GetIDFromRectangle
                     ((ImGuiWindow *)(ulong)in_stack_ffffffffffffffe0,(ImRect *)0x0);
      (pIVar8->LastItemData).ID = id;
      KeepAliveID(id);
      bVar1 = ItemHoverable(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
                            in_stack_ffffffffffffffc0);
      if ((bVar1) && (((pIVar8->IO).MouseClicked[iVar6] & 1U) != 0)) {
        SetActiveID((ImGuiID)((ulong)pIVar8 >> 0x20),pIVar7);
        FocusWindow(unaff_retaddr,in_stack_fffffffffffffffc);
      }
      if (pIVar8->ActiveId == id) {
        pIVar8->ActiveIdAllowOverlap = bVar1;
      }
    }
    else {
      if (GImGui->ActiveId != id) {
        return false;
      }
      if (GImGui->field_0x40f7 != -1) {
        iVar6 = (int)(char)GImGui->field_0x40f7;
      }
      if ((((GImGui->IO).MouseDown[iVar6] & 1U) == 0) || ((pIVar7->SkipItems & 1U) != 0)) {
        return false;
      }
      GImGui->ActiveIdAllowOverlap = false;
    }
    if (pIVar8->ActiveId != id) {
      return false;
    }
    puVar2 = ImVector<unsigned_int>::back(&pIVar7->IDStack);
    IVar4 = *puVar2;
    bVar1 = IsMouseDragging(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    uVar5 = (uint)bVar1 << 0x18;
    SetActiveIdUsingAllKeyboardKeys();
  }
  else {
    pIVar7 = (ImGuiWindow *)0x0;
    id = ImHashStr("#SourceExtern",0,0);
    uVar5 = 0x1000000;
    iVar6 = -1;
    if (((pIVar8->IO).MouseDown[0] & 1U) != 0) {
      iVar6 = 0;
    }
    KeepAliveID(id);
    SetActiveID((ImGuiID)((ulong)pIVar8 >> 0x20),pIVar7);
  }
  if ((uVar5 & 0x1000000) == 0) {
    bVar1 = false;
  }
  else {
    if ((pIVar8->DragDropActive & 1U) == 0) {
      ClearDragDrop();
      if ((pIVar8->DebugLogFlags & 1U) != 0) {
        pcVar3 = "";
        if ((in_EDI & 0x10) != 0) {
          pcVar3 = " (EXTERN)";
        }
        DebugLog("[dragdrop] BeginDragDropSource() DragDropActive = true, source_id = 0x%08X%s\n",
                 (ulong)id,pcVar3);
      }
      (pIVar8->DragDropPayload).SourceId = id;
      (pIVar8->DragDropPayload).SourceParentId = IVar4;
      pIVar8->DragDropActive = true;
      pIVar8->DragDropSourceFlags = in_EDI;
      pIVar8->DragDropMouseButton = iVar6;
      if ((pIVar8->DragDropPayload).SourceId == pIVar8->ActiveId) {
        pIVar8->ActiveIdNoClearOnFocusLoss = true;
      }
    }
    pIVar8->DragDropSourceFrameCount = pIVar8->FrameCount;
    pIVar8->DragDropWithinSource = true;
    if ((in_EDI & 1) == 0) {
      if ((pIVar8->DragDropAcceptIdPrev == 0) || ((pIVar8->DragDropAcceptFlags & 0x1000U) == 0)) {
        BeginTooltip();
      }
      else {
        BeginTooltipHidden();
      }
    }
    if (((in_EDI & 2) == 0) && ((in_EDI & 0x10) == 0)) {
      (pIVar8->LastItemData).StatusFlags = (pIVar8->LastItemData).StatusFlags & 0xfffffffe;
    }
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool ImGui::BeginDragDropSource(ImGuiDragDropFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // FIXME-DRAGDROP: While in the common-most "drag from non-zero active id" case we can tell the mouse button,
    // in both SourceExtern and id==0 cases we may requires something else (explicit flags or some heuristic).
    ImGuiMouseButton mouse_button = ImGuiMouseButton_Left;

    bool source_drag_active = false;
    ImGuiID source_id = 0;
    ImGuiID source_parent_id = 0;
    if ((flags & ImGuiDragDropFlags_SourceExtern) == 0)
    {
        source_id = g.LastItemData.ID;
        if (source_id != 0)
        {
            // Common path: items with ID
            if (g.ActiveId != source_id)
                return false;
            if (g.ActiveIdMouseButton != -1)
                mouse_button = g.ActiveIdMouseButton;
            if (g.IO.MouseDown[mouse_button] == false || window->SkipItems)
                return false;
            g.ActiveIdAllowOverlap = false;
        }
        else
        {
            // Uncommon path: items without ID
            if (g.IO.MouseDown[mouse_button] == false || window->SkipItems)
                return false;
            if ((g.LastItemData.StatusFlags & ImGuiItemStatusFlags_HoveredRect) == 0 && (g.ActiveId == 0 || g.ActiveIdWindow != window))
                return false;

            // If you want to use BeginDragDropSource() on an item with no unique identifier for interaction, such as Text() or Image(), you need to:
            // A) Read the explanation below, B) Use the ImGuiDragDropFlags_SourceAllowNullID flag.
            if (!(flags & ImGuiDragDropFlags_SourceAllowNullID))
            {
                IM_ASSERT(0);
                return false;
            }

            // Magic fallback to handle items with no assigned ID, e.g. Text(), Image()
            // We build a throwaway ID based on current ID stack + relative AABB of items in window.
            // THE IDENTIFIER WON'T SURVIVE ANY REPOSITIONING/RESIZINGG OF THE WIDGET, so if your widget moves your dragging operation will be canceled.
            // We don't need to maintain/call ClearActiveID() as releasing the button will early out this function and trigger !ActiveIdIsAlive.
            // Rely on keeping other window->LastItemXXX fields intact.
            source_id = g.LastItemData.ID = window->GetIDFromRectangle(g.LastItemData.Rect);
            KeepAliveID(source_id);
            bool is_hovered = ItemHoverable(g.LastItemData.Rect, source_id, g.LastItemData.InFlags);
            if (is_hovered && g.IO.MouseClicked[mouse_button])
            {
                SetActiveID(source_id, window);
                FocusWindow(window);
            }
            if (g.ActiveId == source_id) // Allow the underlying widget to display/return hovered during the mouse release frame, else we would get a flicker.
                g.ActiveIdAllowOverlap = is_hovered;
        }
        if (g.ActiveId != source_id)
            return false;
        source_parent_id = window->IDStack.back();
        source_drag_active = IsMouseDragging(mouse_button);

        // Disable navigation and key inputs while dragging + cancel existing request if any
        SetActiveIdUsingAllKeyboardKeys();
    }
    else
    {
        // When ImGuiDragDropFlags_SourceExtern is set:
        window = NULL;
        source_id = ImHashStr("#SourceExtern");
        source_drag_active = true;
        mouse_button = g.IO.MouseDown[0] ? 0 : -1;
        KeepAliveID(source_id);
        SetActiveID(source_id, NULL);
    }

    IM_ASSERT(g.DragDropWithinTarget == false); // Can't nest BeginDragDropSource() and BeginDragDropTarget()
    if (!source_drag_active)
        return false;

    // Activate drag and drop
    if (!g.DragDropActive)
    {
        IM_ASSERT(source_id != 0);
        ClearDragDrop();
        IMGUI_DEBUG_LOG_ACTIVEID("[dragdrop] BeginDragDropSource() DragDropActive = true, source_id = 0x%08X%s\n",
            source_id, (flags & ImGuiDragDropFlags_SourceExtern) ? " (EXTERN)" : "");
        ImGuiPayload& payload = g.DragDropPayload;
        payload.SourceId = source_id;
        payload.SourceParentId = source_parent_id;
        g.DragDropActive = true;
        g.DragDropSourceFlags = flags;
        g.DragDropMouseButton = mouse_button;
        if (payload.SourceId == g.ActiveId)
            g.ActiveIdNoClearOnFocusLoss = true;
    }
    g.DragDropSourceFrameCount = g.FrameCount;
    g.DragDropWithinSource = true;

    if (!(flags & ImGuiDragDropFlags_SourceNoPreviewTooltip))
    {
        // Target can request the Source to not display its tooltip (we use a dedicated flag to make this request explicit)
        // We unfortunately can't just modify the source flags and skip the call to BeginTooltip, as caller may be emitting contents.
        bool ret;
        if (g.DragDropAcceptIdPrev && (g.DragDropAcceptFlags & ImGuiDragDropFlags_AcceptNoPreviewTooltip))
            ret = BeginTooltipHidden();
        else
            ret = BeginTooltip();
        IM_ASSERT(ret); // FIXME-NEWBEGIN: If this ever becomes false, we need to Begin("##Hidden", NULL, ImGuiWindowFlags_NoSavedSettings) + SetWindowHiddendAndSkipItemsForCurrentFrame().
        IM_UNUSED(ret);
    }

    if (!(flags & ImGuiDragDropFlags_SourceNoDisableHover) && !(flags & ImGuiDragDropFlags_SourceExtern))
        g.LastItemData.StatusFlags &= ~ImGuiItemStatusFlags_HoveredRect;

    return true;
}